

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

int lj_str_haspattern(GCstr *s)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  byte *pbVar4;
  long in_RDI;
  int c;
  char *q;
  char *p;
  byte *local_18;
  
  uVar2 = *(uint *)(in_RDI + 0xc);
  local_18 = (byte *)(in_RDI + 0x10);
  do {
    if ((byte *)(in_RDI + 0x10) + uVar2 <= local_18) {
      return 0;
    }
    pbVar4 = local_18 + 1;
    bVar1 = *local_18;
    local_18 = pbVar4;
  } while (((""[(long)(int)(uint)bVar1 + 1] & 4) == 0) ||
          (pcVar3 = strchr("^$*+?.([%-",(uint)bVar1), pcVar3 == (char *)0x0));
  return 1;
}

Assistant:

int lj_str_haspattern(GCstr *s)
{
  const char *p = strdata(s), *q = p + s->len;
  while (p < q) {
    int c = *(const uint8_t *)p++;
    if (lj_char_ispunct(c) && strchr("^$*+?.([%-", c))
      return 1;  /* Found a pattern matching char. */
  }
  return 0;  /* No pattern matching chars found. */
}